

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

bool flatbuffers::StringIsFlatbufferPositiveInfinity(string *s)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)s);
  bVar2 = true;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)s);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)s);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)s);
        bVar2 = iVar1 == 0;
      }
    }
  }
  return bVar2;
}

Assistant:

inline bool StringIsFlatbufferPositiveInfinity(const std::string &s) {
  return s == "inf" || s == "+inf" || s == "infinity" || s == "+infinity";
}